

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::RenderGridLinesX
               (ImDrawList *DrawList,ImPlotTickCollection *ticks,ImRect *rect,ImU32 col_maj,
               ImU32 col_min,float size_maj,float size_min)

{
  ImPlotTick *pIVar1;
  ImU32 col;
  int t;
  int i;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec4 IVar5;
  ImVec4 col_min4;
  ImVec2 local_60;
  ImVec2 local_58;
  ImU32 local_50;
  float local_4c;
  ImU32 local_48;
  float local_44;
  undefined1 local_40 [12];
  float fStack_34;
  
  fVar3 = (float)ticks->Size / ((rect->Max).x - (rect->Min).x);
  local_4c = size_min;
  local_48 = col_maj;
  local_44 = size_maj;
  IVar5 = ImGui::ColorConvertU32ToFloat4(col_min);
  fVar4 = (fVar3 + -0.1) / -0.1 + 1.0;
  fVar2 = 1.0;
  if (fVar4 <= 1.0) {
    fVar2 = fVar4;
  }
  local_40 = IVar5._0_12_;
  fStack_34 = IVar5.w * (float)(~-(uint)(fVar4 < 0.0) & (uint)fVar2);
  local_50 = ImGui::ColorConvertFloat4ToU32((ImVec4 *)local_40);
  i = 0;
  do {
    if (ticks->Size <= i) {
      return;
    }
    pIVar1 = ImVector<ImPlotTick>::operator[](&ticks->Ticks,i);
    if (pIVar1->Level == 0) {
      if (pIVar1->Major == true) {
        local_58.x = pIVar1->PixelPos;
        local_58.y = (rect->Min).y;
        local_60.y = (rect->Max).y;
        fVar2 = local_44;
        col = local_48;
      }
      else {
        if (0.2 <= fVar3) goto LAB_0019ec31;
        local_58.x = pIVar1->PixelPos;
        local_58.y = (rect->Min).y;
        local_60.y = (rect->Max).y;
        fVar2 = local_4c;
        col = local_50;
      }
      local_60.x = local_58.x;
      ImDrawList::AddLine(DrawList,&local_58,&local_60,col,fVar2);
    }
LAB_0019ec31:
    i = i + 1;
  } while( true );
}

Assistant:

static inline void RenderGridLinesX(ImDrawList& DrawList, const ImPlotTickCollection& ticks, const ImRect& rect, ImU32 col_maj, ImU32 col_min, float size_maj, float size_min) {
    const float density   = ticks.Size / rect.GetWidth();
    ImVec4 col_min4  = ImGui::ColorConvertU32ToFloat4(col_min);
    col_min4.w      *= ImClamp(ImRemap(density, 0.1f, 0.2f, 1.0f, 0.0f), 0.0f, 1.0f);
    col_min = ImGui::ColorConvertFloat4ToU32(col_min4);
    for (int t = 0; t < ticks.Size; t++) {
        const ImPlotTick& xt = ticks.Ticks[t];
        if (xt.Level == 0) {
            if (xt.Major)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_maj, size_maj);
            else if (density < 0.2f)
                DrawList.AddLine(ImVec2(xt.PixelPos, rect.Min.y), ImVec2(xt.PixelPos, rect.Max.y), col_min, size_min);
        }
    }
}